

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::FileDescriptor::FileDescriptor(FileDescriptor *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  FileDescriptor *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  GenericDescriptor::GenericDescriptor(&this->super_GenericDescriptor,d);
  (this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__FileDescriptor_0033a5f8;
  optional_property<unsigned_int>::optional_property(&this->LinkedTrackID);
  Rational::Rational(&this->SampleRate);
  optional_property<unsigned_long_long>::optional_property(&this->ContainerDuration);
  UL::UL(&this->EssenceContainer);
  optional_property<ASDCP::UL>::optional_property(&this->Codec);
  if ((this->super_GenericDescriptor).super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_GenericDescriptor).super_InterchangeObject.m_Dict,
                           MDD_FileDescriptor);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.m_UL,
                  &local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x558,"ASDCP::MXF::FileDescriptor::FileDescriptor(const Dictionary *)");
}

Assistant:

FileDescriptor::FileDescriptor(const Dictionary* d) : GenericDescriptor(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_FileDescriptor);
}